

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

unique_ptr<spdlog::json_formatter,_std::default_delete<spdlog::json_formatter>_> __thiscall
spdlog::details::
make_unique<spdlog::json_formatter,std::unordered_set<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::hash<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::equal_to<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::allocator<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>>>
          (details *this,
          unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
          *args)

{
  json_formatter *this_00;
  string local_40;
  
  this_00 = (json_formatter *)operator_new(0x60);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"\n","");
  json_formatter::json_formatter(this_00,args,&local_40);
  *(json_formatter **)this = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return (__uniq_ptr_data<spdlog::json_formatter,_std::default_delete<spdlog::json_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::json_formatter,_std::default_delete<spdlog::json_formatter>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args &&...args)
{
    static_assert(!std::is_array<T>::value, "arrays not supported");
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}